

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadOpcode(BinaryReader *this,Opcode *out_value,char *desc)

{
  byte bVar1;
  Result RVar2;
  uint uVar3;
  Enum EVar4;
  uint8_t value;
  uint32_t code;
  byte local_2d;
  uint local_2c;
  
  local_2d = 0;
  RVar2 = ReadU8(this,&local_2d,desc);
  bVar1 = local_2d;
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  uVar3 = (uint)local_2d;
  if ((byte)(local_2d + 4) < 3) {
    RVar2 = ReadU32Leb128(this,&local_2c,desc);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    uVar3 = 0x1ff;
    if (local_2c < 0x1ff) {
      uVar3 = local_2c;
    }
    uVar3 = (uint)bVar1 << 9 | uVar3;
    EVar4 = WabtOpcodeCodeTable[uVar3];
    if ((local_2c == 0) || (EVar4 != Unreachable)) goto LAB_001267a4;
  }
  else {
    EVar4 = WabtOpcodeCodeTable[local_2d];
    if (local_2d == 0 || EVar4 != Unreachable) goto LAB_001267a4;
  }
  EVar4 = -uVar3;
LAB_001267a4:
  out_value->enum_ = EVar4;
  return (Result)Ok;
}

Assistant:

Result BinaryReader::ReadOpcode(Opcode* out_value, const char* desc) {
  uint8_t value = 0;
  CHECK_RESULT(ReadU8(&value, desc));

  if (Opcode::IsPrefixByte(value)) {
    uint32_t code;
    CHECK_RESULT(ReadU32Leb128(&code, desc));
    *out_value = Opcode::FromCode(value, code);
  } else {
    *out_value = Opcode::FromCode(value);
  }
  return Result::Ok;
}